

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.h
# Opt level: O2

void __thiscall
Fixpp::result::Result<void,_Fixpp::ErrorKind>::Result
          (Result<void,_Fixpp::ErrorKind> *this,Err<Fixpp::ErrorKind> *err)

{
  undefined1 local_48 [48];
  
  this->ok_ = false;
  ErrorKind::ErrorKind((ErrorKind *)local_48,&err->val);
  details::Storage<void,_Fixpp::ErrorKind>::construct
            (&this->storage_,(Err<Fixpp::ErrorKind> *)local_48);
  std::__cxx11::string::~string((string *)(local_48 + 0x10));
  return;
}

Assistant:

Result(types::Err<E> err)
        : ok_(false)
    {
        storage_.construct(std::move(err));
    }